

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

void __thiscall icu_63::RuleBasedTimeZone::deleteRules(RuleBasedTimeZone *this)

{
  UVector *pUVar1;
  long *plVar2;
  
  if (this->fInitialRule != (InitialTimeZoneRule *)0x0) {
    (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  this->fInitialRule = (InitialTimeZoneRule *)0x0;
  if (this->fHistoricRules != (UVector *)0x0) {
    while (pUVar1 = this->fHistoricRules, pUVar1->count != 0) {
      plVar2 = (long *)UVector::orphanElementAt(pUVar1,0);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))(plVar2);
      }
    }
    if (pUVar1 != (UVector *)0x0) {
      (*(pUVar1->super_UObject)._vptr_UObject[1])();
    }
    this->fHistoricRules = (UVector *)0x0;
  }
  if (this->fFinalRules != (UVector *)0x0) {
    while (pUVar1 = this->fFinalRules, pUVar1->count != 0) {
      plVar2 = (long *)UVector::orphanElementAt(pUVar1,0);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))(plVar2);
      }
    }
    if (pUVar1 != (UVector *)0x0) {
      (*(pUVar1->super_UObject)._vptr_UObject[1])();
    }
    this->fFinalRules = (UVector *)0x0;
  }
  return;
}

Assistant:

void
RuleBasedTimeZone::deleteRules(void) {
    delete fInitialRule;
    fInitialRule = NULL;
    if (fHistoricRules != NULL) {
        while (!fHistoricRules->isEmpty()) {
            delete (TimeZoneRule*)(fHistoricRules->orphanElementAt(0));
        }
        delete fHistoricRules;
        fHistoricRules = NULL;
    }
    if (fFinalRules != NULL) {
        while (!fFinalRules->isEmpty()) {
            delete (AnnualTimeZoneRule*)(fFinalRules->orphanElementAt(0));
        }
        delete fFinalRules;
        fFinalRules = NULL;
    }
}